

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> * __thiscall
kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>::
emplace<kj::Promise<kj::HttpServer::Connection::LoopResult>>
          (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>> *this,
          Promise<kj::HttpServer::Connection::LoopResult> *params)

{
  Promise<kj::HttpServer::Connection::LoopResult> *params_00;
  Promise<kj::HttpServer::Connection::LoopResult> *params_local;
  NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>)0x0;
    dtor<kj::Promise<kj::HttpServer::Connection::LoopResult>>
              ((Promise<kj::HttpServer::Connection::LoopResult> *)(this + 8));
  }
  params_00 = fwd<kj::Promise<kj::HttpServer::Connection::LoopResult>>(params);
  ctor<kj::Promise<kj::HttpServer::Connection::LoopResult>,kj::Promise<kj::HttpServer::Connection::LoopResult>>
            ((Promise<kj::HttpServer::Connection::LoopResult> *)(this + 8),params_00);
  *this = (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>)0x1;
  return (Promise<kj::HttpServer::Connection::LoopResult> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }